

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.cc
# Opt level: O1

void __thiscall
tchecker::parsing::system::parser_t::stack_symbol_type::stack_symbol_type
          (stack_symbol_type *this,state_type s,symbol_type *that)

{
  value_type *this_00;
  value_type *pvVar1;
  symbol_kind_type sVar2;
  filename_type *pfVar3;
  counter_type cVar4;
  counter_type cVar5;
  counter_type cVar6;
  counter_type cVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u;
  shared_ptr<tchecker::parsing::attr_t> *u_00;
  shared_ptr<tchecker::parsing::sync_constraint_t> *u_01;
  
  (this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).super_by_state.state = s
  ;
  *(undefined8 *)
   &(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value.field_0 = 0;
  *(undefined8 *)
   ((long)&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value.field_0 +
   8) = 0;
  *(undefined8 *)
   ((long)&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value.field_0 +
   0x10) = 0;
  *(undefined8 *)
   ((long)&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value.field_0 +
   0x18) = 0;
  *(undefined8 *)
   ((long)&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value.field_0 +
   0x20) = 0;
  *(undefined8 *)
   ((long)&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value.field_0 +
   0x28) = 0;
  *(undefined8 *)
   ((long)&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value.field_0 +
   0x30) = 0;
  (this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value.yytypeid_ =
       (type_info *)0x0;
  pfVar3 = (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).location.begin.
           filename;
  cVar6 = (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).location.begin.
          line;
  cVar7 = (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).location.begin.
          column;
  cVar4 = (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).location.end.line
  ;
  cVar5 = (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).location.end.
          column;
  (this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.end.filename =
       (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).location.end.
       filename;
  (this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.end.line =
       cVar4;
  (this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.end.column =
       cVar5;
  (this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.begin.filename
       = pfVar3;
  (this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.begin.line =
       cVar6;
  (this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.begin.column =
       cVar7;
  sVar2 = (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).super_by_kind.
          kind_;
  if ((uint)(sVar2 + ~S_TOK_EVENT) < 0x19) {
    this_00 = &(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value;
    switch(sVar2) {
    case S_TOK_ID:
    case S_TOK_INTEGER:
    case S_TOK_TEXT:
    case S_text_or_empty:
      pvVar1 = &(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).value;
      u = value_type::as<std::__cxx11::string>(pvVar1);
      value_type::emplace<std::__cxx11::string,std::__cxx11::string>(this_00,u);
      value_type::destroy<std::__cxx11::string>(pvVar1);
      break;
    case S_attr_list:
    case S_non_empty_attr_list:
      value_type::move<tchecker::parsing::attributes_t>
                (this_00,&(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).
                          value);
      break;
    case S_attr:
      pvVar1 = &(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).value;
      u_00 = value_type::as<std::shared_ptr<tchecker::parsing::attr_t>>(pvVar1);
      value_type::
      emplace<std::shared_ptr<tchecker::parsing::attr_t>,std::shared_ptr<tchecker::parsing::attr_t>>
                (this_00,u_00);
      value_type::destroy<std::shared_ptr<tchecker::parsing::attr_t>>(pvVar1);
      break;
    case S_sync_constraint_list:
      value_type::
      move<std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>>>>
                (this_00,&(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).
                          value);
      break;
    case S_sync_constraint:
      pvVar1 = &(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).value;
      u_01 = value_type::as<std::shared_ptr<tchecker::parsing::sync_constraint_t>>(pvVar1);
      value_type::
      emplace<std::shared_ptr<tchecker::parsing::sync_constraint_t>,std::shared_ptr<tchecker::parsing::sync_constraint_t>>
                (this_00,u_01);
      value_type::destroy<std::shared_ptr<tchecker::parsing::sync_constraint_t>>(pvVar1);
      break;
    case S_sync_strength:
      value_type::move<tchecker::sync_strength_t>
                (this_00,&(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).
                          value);
      break;
    case S_integer:
      value_type::move<int>
                (this_00,&(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).
                          value);
      break;
    case S_uinteger:
      value_type::move<unsigned_int>
                (this_00,&(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).
                          value);
    }
  }
  (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).super_by_kind.kind_ =
       S_YYEMPTY;
  return;
}

Assistant:

parser_t::stack_symbol_type::stack_symbol_type (state_type s, YY_MOVE_REF (symbol_type) that)
    : super_type (s, YY_MOVE (that.location))
  {
    switch (that.kind ())
    {
      case symbol_kind::S_sync_strength: // sync_strength
        value.move< enum tchecker::sync_strength_t > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_attr: // attr
        value.move< std::shared_ptr<tchecker::parsing::attr_t> > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_sync_constraint: // sync_constraint
        value.move< std::shared_ptr<tchecker::parsing::sync_constraint_t> > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_TOK_ID: // "identifier"
      case symbol_kind::S_TOK_INTEGER: // "integer value"
      case symbol_kind::S_TOK_TEXT: // "text value"
      case symbol_kind::S_text_or_empty: // text_or_empty
        value.move< std::string > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_sync_constraint_list: // sync_constraint_list
        value.move< std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>> > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_integer: // integer
        value.move< tchecker::integer_t > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_attr_list: // attr_list
      case symbol_kind::S_non_empty_attr_list: // non_empty_attr_list
        value.move< tchecker::parsing::attributes_t > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_uinteger: // uinteger
        value.move< unsigned int > (YY_MOVE (that.value));
        break;

      default:
        break;
    }

    // that is emptied.
    that.kind_ = symbol_kind::S_YYEMPTY;
  }